

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport.cpp
# Opt level: O3

void __thiscall MockSupport::clear(MockSupport *this)

{
  MockNamedValueList *this_00;
  MockSupport *pMVar1;
  MockSupport *pMVar2;
  MockSupport *node;
  
  if (this->lastActualFunctionCall_ != (MockCheckedActualCall *)0x0) {
    (*(this->lastActualFunctionCall_->super_MockActualCall)._vptr_MockActualCall[1])();
  }
  this->lastActualFunctionCall_ = (MockCheckedActualCall *)0x0;
  this->tracing_ = false;
  MockActualCallTrace::clearInstance();
  MockExpectedCallsList::deleteAllExpectationsAndClearList(&this->expectations_);
  this->ignoreOtherCalls_ = false;
  this->enabled_ = true;
  this_00 = &this->data_;
  this->actualCallOrder_ = 0;
  this->expectedCallOrder_ = 0;
  this->strictOrdering_ = false;
  pMVar2 = (MockSupport *)this_00;
  pMVar1 = (MockSupport *)MockNamedValueList::begin(this_00);
  while (node = pMVar1, node != (MockSupport *)0x0) {
    pMVar2 = getMockSupport(pMVar2,(MockNamedValueListNode *)node);
    if (pMVar2 != (MockSupport *)0x0) {
      (*pMVar2->_vptr_MockSupport[0x27])(pMVar2);
      (*pMVar2->_vptr_MockSupport[1])(pMVar2);
    }
    pMVar1 = (MockSupport *)MockNamedValueListNode::next((MockNamedValueListNode *)node);
    pMVar2 = node;
  }
  MockNamedValueList::clear(this_00);
  return;
}

Assistant:

void MockSupport::clear()
{
    delete lastActualFunctionCall_;
    lastActualFunctionCall_ = NULLPTR;

    tracing_ = false;
    MockActualCallTrace::clearInstance();

    expectations_.deleteAllExpectationsAndClearList();
    ignoreOtherCalls_ = false;
    enabled_ = true;
    actualCallOrder_ = 0;
    expectedCallOrder_ = 0;
    strictOrdering_ = false;

    for (MockNamedValueListNode* p = data_.begin(); p; p = p->next()) {
        MockSupport* support = getMockSupport(p);
        if (support) {
            support->clear();
            delete support;
        }
    }
    data_.clear();
}